

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecifySymbols.cpp
# Opt level: O1

Expression *
slang::ast::bindTerminal
          (ExpressionSyntax *syntax,SpecifyTerminalDir dir,Scope *parentParent,ASTContext *context)

{
  bool bVar1;
  int iVar2;
  SourceLocation in_RAX;
  undefined4 extraout_var;
  DiagCode code;
  SourceLocation unaff_RBX;
  Expression *pEVar3;
  SourceRange SVar4;
  Expression *this;
  
  iVar2 = Expression::bind((int)syntax,(sockaddr *)context,0);
  this = (Expression *)CONCAT44(extraout_var,iVar2);
  bVar1 = Expression::bad(this);
  if (!bVar1) {
    pEVar3 = this;
    if ((this->kind & ~IntegerLiteral) == ElementSelect) {
      pEVar3 = *(Expression **)(this + 1);
    }
    if ((pEVar3->kind == NamedValue) ||
       ((pEVar3->kind == HierarchicalValue &&
        (bVar1 = HierarchicalReference::isViaIfacePort((HierarchicalReference *)&pEVar3[1].type),
        bVar1)))) {
      SVar4.endLoc = unaff_RBX;
      SVar4.startLoc = in_RAX;
      bVar1 = SpecifyBlockSymbol::checkPathTerminal
                        (*(SpecifyBlockSymbol **)(pEVar3 + 1),(ValueSymbol *)(this->type).ptr,
                         (Type *)parentParent,(Scope *)(ulong)dir,
                         SUB84((pEVar3->sourceRange).startLoc,0),SVar4);
      if (bVar1) {
        return this;
      }
    }
    else {
      code.subsystem = Declarations;
      code.code = 100;
      if ((pEVar3->kind & ~IntegerLiteral) == ElementSelect) {
        code.subsystem = Declarations;
        code.code = 0xc0;
      }
      SVar4 = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
      ASTContext::addDiag(context,code,SVar4);
    }
  }
  return (Expression *)0x0;
}

Assistant:

static const Expression* bindTerminal(const ExpressionSyntax& syntax,
                                      SpecifyBlockSymbol::SpecifyTerminalDir dir,
                                      const Scope* parentParent, ASTContext& context) {
    auto expr = &Expression::bind(syntax, context);
    if (expr->bad())
        return nullptr;

    const Expression* valueExpr;
    switch (expr->kind) {
        case ExpressionKind::ElementSelect:
            valueExpr = &expr->as<ElementSelectExpression>().value();
            break;
        case ExpressionKind::RangeSelect:
            valueExpr = &expr->as<RangeSelectExpression>().value();
            break;
        default:
            valueExpr = expr;
            break;
    }

    if (valueExpr->kind != ExpressionKind::NamedValue &&
        (valueExpr->kind != ExpressionKind::HierarchicalValue ||
         !valueExpr->as<HierarchicalValueExpression>().ref.isViaIfacePort())) {
        auto code = (valueExpr->kind == ExpressionKind::ElementSelect ||
                     valueExpr->kind == ExpressionKind::RangeSelect)
                        ? diag::SpecifyPathMultiDim
                        : diag::InvalidSpecifyPath;
        context.addDiag(code, syntax.sourceRange());
    }
    else {
        auto& symbol = valueExpr->as<ValueExpressionBase>().symbol;
        if (SpecifyBlockSymbol::checkPathTerminal(symbol, *expr->type, *parentParent, dir,
                                                  valueExpr->sourceRange)) {
            return expr;
        }
    }

    return nullptr;
}